

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

string * __thiscall
HawkTracer::client::Converter::_get_label_abi_cxx11_
          (string *__return_storage_ptr__,Converter *this,Event *event)

{
  HT_EventKlassId HVar1;
  HT_EventKlassId HVar2;
  TracepointMap *this_00;
  bool bVar3;
  ulong id;
  char *pcVar4;
  mapped_type *value;
  string *this_01;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  key_type local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->_mapping_klass_id == 0) {
    _try_setting_mapping_klass_id(this,event);
    return __return_storage_ptr__;
  }
  std::__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2> *)
             &local_88,
             (__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2> *)
             (event + 0x38));
  HVar1 = *(HT_EventKlassId *)(local_88._M_dataplus._M_p + 0x60);
  HVar2 = this->_mapping_klass_id;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  if (HVar1 == HVar2) {
    this_00 = (this->_tracepoint_map)._M_t.
              super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
              ._M_t.
              super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
              .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_88,"identifier",&local_8b);
    id = HawkTracer::parser::Event::get_value<unsigned_long>((string *)event);
    std::__cxx11::string::string((string *)&local_68,"label",&local_89);
    pcVar4 = HawkTracer::parser::Event::get_value<char*>((string *)event);
    std::__cxx11::string::string((string *)&local_48,pcVar4,&local_8a);
    TracepointMap::add_map_entry(this_00,id,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::string::string((string *)&local_88,"label",(allocator *)&local_68);
    bVar3 = parser::Event::has_value(event,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_68,"label",&local_8b);
      value = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)event,&local_68);
      _convert_value_to_string_abi_cxx11_(&local_88,this,value);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      this_01 = &local_68;
      goto LAB_00114b8b;
    }
    std::__cxx11::string::string((string *)&local_88,"name",(allocator *)&local_68);
    bVar3 = parser::Event::has_value(event,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_88,"name",(allocator *)&local_68);
    HawkTracer::parser::Event::get_value<char*>((string *)event);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  this_01 = &local_88;
LAB_00114b8b:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string Converter::_get_label(const parser::Event& event)
{
    std::string label;

    if (_mapping_klass_id == 0)
    {
        _try_setting_mapping_klass_id(event);
    }
    else if (event.get_klass()->get_id() == _mapping_klass_id)
    {
        _tracepoint_map->add_map_entry(event.get_value<uint64_t>("identifier"), event.get_value<char*>("label"));
    } 
    else if (event.has_value("label"))
    {
        label = _convert_value_to_string(event.get_raw_value("label")); 
    }
    else if (event.has_value("name"))
    {
        label = event.get_value<char*>("name");
    }
    return label;
}